

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O3

void m256v_copy_col(m256v *M1,int c1,m256v *Mt,int ct)

{
  long lVar1;
  
  if (0 < Mt->n_row) {
    lVar1 = 0;
    do {
      Mt->e[(long)ct + Mt->rstride * lVar1] = M1->e[(long)c1 + M1->rstride * lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 < Mt->n_row);
  }
  return;
}

Assistant:

void m256v_copy_col(const m256v* M1,
			int c1,
			m256v* Mt,
			int ct)
{
	assert (M1->n_row == Mt->n_row);

	for (int i = 0; i < Mt->n_row; ++i) {
		set_el(Mt, i, ct, get_el(M1, i, c1));
	}
}